

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructDeserializer.hpp
# Opt level: O2

void mserialize::
     StructDeserializer<binlog::WriterProp,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::id>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::WriterProp::*,_&binlog::WriterProp::name>,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::batchSize>_>
     ::deserialize<binlog::Range>(WriterProp *t,Range *istream)

{
  detail::TrivialDeserializer<unsigned_long>::deserialize<binlog::Range>(&t->id,istream);
  detail::
  BuiltinDeserializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::deserialize<binlog::Range>(&t->name,istream);
  detail::TrivialDeserializer<unsigned_long>::deserialize<binlog::Range>(&t->batchSize,istream);
  return;
}

Assistant:

static void deserialize(T& t, InputStream& istream)
  {
    using swallow = int[];
    (void)swallow{1, (deserialize_member(t, Members::value, istream), int{})...};
  }